

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialFormat.cpp
# Opt level: O1

TrackData * GenerateKBI19Track(TrackData *__return_storage_ptr__,CylHead *cylhead,Track *track)

{
  pointer puVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__x;
  BitBuffer *bitstream;
  ulong uVar5;
  int iVar6;
  pointer this;
  initializer_list<unsigned_char> __l;
  Data data;
  BitstreamTrackBuilder bitbuf;
  allocator_type local_f9;
  void *local_f8 [2];
  long local_e8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_e0;
  TrackData *local_c8;
  CylHead *local_c0;
  pointer local_b8;
  BitstreamTrackBuilder local_b0;
  
  local_c8 = __return_storage_ptr__;
  local_c0 = cylhead;
  bVar2 = IsKBI19Track(track);
  if (bVar2) {
    if (GenerateKBI19Track(CylHead_const&,Track_const&)::gap2_sig == '\0') {
      iVar6 = __cxa_guard_acquire(&GenerateKBI19Track(CylHead_const&,Track_const&)::gap2_sig);
      if (iVar6 != 0) {
        local_b0.super_TrackBuilder._vptr_TrackBuilder._0_4_ = 0x49424b20;
        local_b0.super_TrackBuilder._vptr_TrackBuilder._4_1_ = 0x20;
        __l._M_len = 5;
        __l._M_array = (iterator)&local_b0;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&GenerateKBI19Track::gap2_sig.
                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>,__l,
                   (allocator_type *)&local_e0);
        __cxa_atexit(std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector,
                     &GenerateKBI19Track::gap2_sig,&__dso_handle);
        __cxa_guard_release(&GenerateKBI19Track(CylHead_const&,Track_const&)::gap2_sig);
      }
    }
    BitstreamTrackBuilder::BitstreamTrackBuilder(&local_b0,_250K,MFM);
    TrackBuilder::addGap(&local_b0.super_TrackBuilder,0x40,-1);
    TrackBuilder::addIAM(&local_b0.super_TrackBuilder);
    TrackBuilder::addGap(&local_b0.super_TrackBuilder,0x32,-1);
    this = (track->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
           super__Vector_impl_data._M_start;
    local_b8 = (track->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
               super__Vector_impl_data._M_finish;
    if (this != local_b8) {
      iVar6 = 0;
      uVar5 = 0;
      do {
        TrackBuilder::addSectorHeader(&local_b0.super_TrackBuilder,&this->header,false);
        if ((this->header).sector == 0) {
          TrackBuilder::addGap(&local_b0.super_TrackBuilder,0x11,-1);
          TrackBuilder::addBlock(&local_b0.super_TrackBuilder,&GenerateKBI19Track::gap2_sig);
        }
        else {
          TrackBuilder::addGap(&local_b0.super_TrackBuilder,8,-1);
          TrackBuilder::addBlock(&local_b0.super_TrackBuilder,&GenerateKBI19Track::gap2_sig);
          TrackBuilder::addGap(&local_b0.super_TrackBuilder,9,-1);
        }
        TrackBuilder::addAM(&local_b0.super_TrackBuilder,(uint)this->dam,false);
        __x = &Sector::data_copy(this,0)->
               super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_e0,__x);
        if ((int)(uVar5 / 3) * 3 + iVar6 == 0) {
          if ((this->header).sector == 0) {
            iVar3 = Sector::size(this);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      (&local_e0,(long)iVar3);
            TrackBuilder::addBlock(&local_b0.super_TrackBuilder,(Data *)&local_e0);
            BitstreamTrackBuilder::addCrc(&local_b0,0x204);
          }
          else {
            iVar3 = Sector::size(this);
            std::vector<unsigned_char,std::allocator<unsigned_char>>::
            vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_f8,
                       (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        )local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                       (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        )(local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start + 0x10e),&local_f9);
            TrackBuilder::addBlock(&local_b0.super_TrackBuilder,(Data *)local_f8);
            if (local_f8[0] != (void *)0x0) {
              operator_delete(local_f8[0],local_e8 - (long)local_f8[0]);
            }
            iVar3 = iVar3 + 4;
            BitstreamTrackBuilder::addCrc(&local_b0,iVar3);
            std::vector<unsigned_char,std::allocator<unsigned_char>>::
            vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_f8,
                       (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        )(local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start + 0x110),
                       (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        )(local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start + 0x187),&local_f9);
            TrackBuilder::addBlock(&local_b0.super_TrackBuilder,(Data *)local_f8);
            if (local_f8[0] != (void *)0x0) {
              operator_delete(local_f8[0],local_e8 - (long)local_f8[0]);
            }
            BitstreamTrackBuilder::addCrc(&local_b0,iVar3);
            puVar1 = local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            iVar4 = Sector::size(this);
            std::vector<unsigned_char,std::allocator<unsigned_char>>::
            vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_f8,
                       (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        )(puVar1 + 0x189),
                       (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        )(puVar1 + iVar4),&local_f9);
            TrackBuilder::addBlock(&local_b0.super_TrackBuilder,(Data *)local_f8);
            if (local_f8[0] != (void *)0x0) {
              operator_delete(local_f8[0],local_e8 - (long)local_f8[0]);
            }
            BitstreamTrackBuilder::addCrc(&local_b0,iVar3);
            TrackBuilder::addGap(&local_b0.super_TrackBuilder,0x50,-1);
          }
        }
        else {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_e0,0x3d);
          TrackBuilder::addBlock(&local_b0.super_TrackBuilder,(Data *)&local_e0);
        }
        if (local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (uchar *)0x0) {
          operator_delete(local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_e0.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_e0.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        this = this + 1;
        iVar6 = iVar6 + -1;
        uVar5 = (ulong)((int)uVar5 + 1);
      } while (this != local_b8);
    }
    TrackBuilder::addGap(&local_b0.super_TrackBuilder,0x5a,-1);
    bitstream = BitstreamTrackBuilder::buffer(&local_b0);
    TrackData::TrackData(local_c8,local_c0,bitstream);
    if (local_b0.m_buffer.m_sync_losses.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b0.m_buffer.m_sync_losses.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_b0.m_buffer.m_sync_losses.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_b0.m_buffer.m_sync_losses.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_b0.m_buffer.m_indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b0.m_buffer.m_indexes.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_b0.m_buffer.m_indexes.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_b0.m_buffer.m_indexes.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_b0.m_buffer.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b0.m_buffer.m_data.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_b0.m_buffer.m_data.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_b0.m_buffer.m_data.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    return local_c8;
  }
  __assert_fail("IsKBI19Track(track)",
                "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/SpecialFormat.cpp"
                ,0x3a,"TrackData GenerateKBI19Track(const CylHead &, const Track &)");
}

Assistant:

TrackData GenerateKBI19Track(const CylHead& cylhead, const Track& track)
{
    assert(IsKBI19Track(track));

    static const Data gap2_sig{ 0x20,0x4B,0x42,0x49,0x20 }; // " KBI "
    BitstreamTrackBuilder bitbuf(DataRate::_250K, Encoding::MFM);

    // Track start with slightly shorter gap4a.
    bitbuf.addGap(64);
    bitbuf.addIAM();
    bitbuf.addGap(50);

    int sector_index = 0;
    for (auto& s : track)
    {
        bitbuf.addSectorHeader(s.header);

        if (s.header.sector == 0)
        {
            bitbuf.addGap(17);
            bitbuf.addBlock(gap2_sig);
        }
        else
        {
            bitbuf.addGap(8);
            bitbuf.addBlock(gap2_sig);
            bitbuf.addGap(9);
        }

        bitbuf.addAM(s.dam);
        auto data = s.data_copy();

        // Short or full sector data?
        if (sector_index++ % 3)
        {
            data.resize(61);
            bitbuf.addBlock(data);
        }
        else
        {
            if (s.header.sector == 0)
            {
                data.resize(s.size());
                bitbuf.addBlock(data);
                bitbuf.addCrc(3 + 1 + 512);
            }
            else
            {
                auto crc_block_size = 3 + 1 + s.size();
                bitbuf.addBlock({ data.begin() + 0, data.begin() + 0x10e });
                bitbuf.addCrc(crc_block_size);
                bitbuf.addBlock({ data.begin() + 0x110, data.begin() + 0x187 });
                bitbuf.addCrc(crc_block_size);
                bitbuf.addBlock({ data.begin() + 0x189, data.begin() + s.size() });
                bitbuf.addCrc(crc_block_size);
                bitbuf.addGap(80);
            }
        }
    }

    // Pad up to normal track size.
    bitbuf.addGap(90);

    return TrackData(cylhead, std::move(bitbuf.buffer()));
}